

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_entityValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  bool bVar6;
  
  iVar2 = -4;
  if (ptr < end) {
    bVar6 = (long)end - (long)ptr < 0;
    if (end == ptr || bVar6) {
      iVar2 = -1;
    }
    else {
      pbVar4 = (byte *)ptr;
      if (end != ptr && !bVar6) {
        do {
          cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
          switch(cVar1) {
          case '\x03':
            if (pbVar4 == (byte *)ptr) {
              iVar2 = normal_scanRef(enc,(char *)(pbVar4 + 1),end,nextTokPtr);
              return iVar2;
            }
            goto LAB_0058ca23;
          case '\x04':
          case '\b':
            goto switchD_0058c9e2_caseD_4;
          case '\x05':
            lVar5 = 2;
            break;
          case '\x06':
            lVar5 = 3;
            break;
          case '\a':
            lVar5 = 4;
            break;
          case '\t':
            if (pbVar4 == (byte *)ptr) {
              pbVar3 = pbVar4 + 1;
              if ((byte *)end != pbVar3 && -1 < (long)end - (long)pbVar3) {
                if (*(char *)((long)enc[1].scanners + (ulong)pbVar4[1]) == '\n') {
                  pbVar3 = pbVar4 + 2;
                }
                *nextTokPtr = (char *)pbVar3;
                return 7;
              }
              return -3;
            }
            goto LAB_0058ca23;
          case '\n':
            if (pbVar4 == (byte *)ptr) {
              *nextTokPtr = (char *)(pbVar4 + 1);
              return 7;
            }
            goto LAB_0058ca23;
          default:
            if (cVar1 == '\x1e') {
              if (pbVar4 == (byte *)ptr) {
                iVar2 = normal_scanPercent(enc,(char *)(pbVar4 + 1),end,nextTokPtr);
                if (iVar2 != 0x16) {
                  return iVar2;
                }
                return 0;
              }
              goto LAB_0058ca23;
            }
switchD_0058c9e2_caseD_4:
            lVar5 = 1;
          }
          pbVar4 = pbVar4 + lVar5;
        } while ((byte *)end != pbVar4 && -1 < (long)end - (long)pbVar4);
      }
LAB_0058ca23:
      *nextTokPtr = (char *)pbVar4;
      iVar2 = 6;
    }
  }
  return iVar2;
}

Assistant:

static int PTRCALL
PREFIX(entityValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr) {
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end)) {
    /* This line cannot be executed.  The incoming data has already
     * been tokenized once, so incomplete characters like this have
     * already been eliminated from the input.  Retaining the paranoia
     * check is still valuable, however.
     */
    return XML_TOK_PARTIAL; /* LCOV_EXCL_LINE */
  }
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_PERCNT:
      if (ptr == start) {
        int tok = PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
        return (tok == XML_TOK_PERCENT) ? XML_TOK_INVALID : tok;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}